

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O1

vector<double,_std::allocator<double>_> *
cppnet::any_cast<std::vector<double,std::allocator<double>>>(Any *operand)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  
  if (operand == (Any *)0x0) {
    return (vector<double,_std::allocator<double>_> *)0x0;
  }
  if (operand->_content == (CPlaceHolder *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*operand->_content->_vptr_CPlaceHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 == "St6vectorIdSaIdEE") {
LAB_0010fdc2:
    pvVar3 = (vector<double,_std::allocator<double>_> *)(operand->_content + 1);
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"St6vectorIdSaIdEE");
      if (iVar1 == 0) goto LAB_0010fdc2;
    }
    pvVar3 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  return pvVar3;
}

Assistant:

ValueType* any_cast(Any * operand)  {
    if (operand && operand->Type() == typeid(ValueType)) {
        return &static_cast<Any::CHolder<ValueType> *>(operand->_content)->_held;
    }
    return nullptr;
}